

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  RowSetEntry *in_RDI;
  long in_FS_OFFSET;
  RowSetEntry *pNext;
  uint i;
  RowSetEntry *aBucket [40];
  RowSetEntry *in_stack_fffffffffffffe98;
  RowSetEntry *pA;
  uint local_154;
  RowSetEntry *local_150;
  RowSetEntry *local_148 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pA = (RowSetEntry *)&DAT_aaaaaaaaaaaaaaaa;
  memset(local_148,0xaa,0x140);
  memset(local_148,0,0x140);
  local_150 = in_RDI;
  while (local_150 != (RowSetEntry *)0x0) {
    pA = local_150->pRight;
    local_150->pRight = (RowSetEntry *)0x0;
    for (local_154 = 0; local_148[local_154] != (RowSetEntry *)0x0; local_154 = local_154 + 1) {
      local_150 = rowSetEntryMerge(pA,in_stack_fffffffffffffe98);
      local_148[local_154] = (RowSetEntry *)0x0;
    }
    local_148[local_154] = local_150;
    local_150 = pA;
  }
  local_150 = local_148[0];
  for (local_154 = 1; local_154 < 0x28; local_154 = local_154 + 1) {
    if (local_148[local_154] != (RowSetEntry *)0x0) {
      if (local_150 == (RowSetEntry *)0x0) {
        in_stack_fffffffffffffe98 = local_148[local_154];
        local_150 = in_stack_fffffffffffffe98;
      }
      else {
        in_stack_fffffffffffffe98 = rowSetEntryMerge(pA,in_stack_fffffffffffffe98);
        local_150 = in_stack_fffffffffffffe98;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_150;
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = aBucket[0];
  for(i=1; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    if( aBucket[i]==0 ) continue;
    pIn = pIn ? rowSetEntryMerge(pIn, aBucket[i]) : aBucket[i];
  }
  return pIn;
}